

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_return.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::dispatch::detail::Handle_Return<Object_Copy_Count_Test>::
handle<Object_Copy_Count_Test,void>
          (Handle_Return<Object_Copy_Count_Test> *this,Object_Copy_Count_Test *r)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar2;
  Boxed_Value BVar3;
  undefined1 local_21;
  shared_ptr<Object_Copy_Count_Test> local_20;
  
  local_20.super___shared_ptr<Object_Copy_Count_Test,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Object_Copy_Count_Test,std::allocator<Object_Copy_Count_Test>,Object_Copy_Count_Test>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_20.super___shared_ptr<Object_Copy_Count_Test,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(Object_Copy_Count_Test **)&local_20,
             (allocator<Object_Copy_Count_Test> *)&local_21,r);
  sVar2 = Boxed_Value::Object_Data::get<Object_Copy_Count_Test>((Object_Data *)this,&local_20,true);
  _Var1 = sVar2.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (local_20.super___shared_ptr<Object_Copy_Count_Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<Object_Copy_Count_Test,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX;
  }
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value handle(T &&r) {
          return Boxed_Value(std::make_shared<T>(std::forward<T>(r)), true);
        }